

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

llama_model_params * common_model_params_to_llama(common_params *params)

{
  bool bVar1;
  ggml_backend_device **ppgVar2;
  reference pvVar3;
  llama_model_kv_override *plVar4;
  reference pvVar5;
  llama_model_tensor_buft_override *plVar6;
  long in_RSI;
  llama_model_params *in_RDI;
  vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *unaff_retaddr;
  llama_model_params *this;
  
  this = in_RDI;
  llama_model_default_params();
  bVar1 = std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::empty
                    (unaff_retaddr);
  if (!bVar1) {
    ppgVar2 = std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::data
                        ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
                         0x32beea);
    in_RDI->devices = ppgVar2;
  }
  if (*(int *)(in_RSI + 0x68) != -1) {
    in_RDI->n_gpu_layers = *(int32_t *)(in_RSI + 0x68);
  }
  in_RDI->main_gpu = *(int32_t *)(in_RSI + 0x6c);
  in_RDI->split_mode = *(llama_split_mode *)(in_RSI + 0x270);
  in_RDI->tensor_split = (float *)(in_RSI + 0x70);
  in_RDI->use_mmap = (bool)(*(byte *)(in_RSI + 0x102a) & 1);
  in_RDI->use_mlock = (bool)(*(byte *)(in_RSI + 0x102b) & 1);
  in_RDI->check_tensors = (bool)(*(byte *)(in_RSI + 0x1031) & 1);
  bVar1 = std::vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>::empty
                    ((vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_> *)
                     unaff_retaddr);
  if (bVar1) {
    in_RDI->kv_overrides = (llama_model_kv_override *)0x0;
  }
  else {
    pvVar3 = std::vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>::back
                       ((vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_> *
                        )this);
    if (pvVar3->key[0] != '\0') {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
                 ,0x433,"GGML_ASSERT(%s) failed",
                 "params.kv_overrides.back().key[0] == 0 && \"KV overrides not terminated with empty key\""
                );
    }
    plVar4 = std::vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>::data
                       ((vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_> *
                        )0x32bfdc);
    in_RDI->kv_overrides = plVar4;
  }
  bVar1 = std::
          vector<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
          ::empty((vector<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
                   *)unaff_retaddr);
  if (bVar1) {
    in_RDI->tensor_buft_overrides = (llama_model_tensor_buft_override *)0x0;
  }
  else {
    pvVar5 = std::
             vector<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
             ::back((vector<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
                     *)this);
    if (pvVar5->pattern != (char *)0x0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
                 ,0x43a,"GGML_ASSERT(%s) failed",
                 "params.tensor_buft_overrides.back().pattern == nullptr && \"Tensor buffer overrides not terminated with empty pattern\""
                );
    }
    plVar6 = std::
             vector<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
             ::data((vector<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
                     *)0x32c055);
    in_RDI->tensor_buft_overrides = plVar6;
  }
  return this;
}

Assistant:

struct llama_model_params common_model_params_to_llama(common_params & params) {
    auto mparams = llama_model_default_params();

    if (!params.devices.empty()) {
        mparams.devices = params.devices.data();
    }

    if (params.n_gpu_layers != -1) {
        mparams.n_gpu_layers = params.n_gpu_layers;
    }

    mparams.main_gpu        = params.main_gpu;
    mparams.split_mode      = params.split_mode;
    mparams.tensor_split    = params.tensor_split;
    mparams.use_mmap        = params.use_mmap;
    mparams.use_mlock       = params.use_mlock;
    mparams.check_tensors   = params.check_tensors;

    if (params.kv_overrides.empty()) {
        mparams.kv_overrides = NULL;
    } else {
        GGML_ASSERT(params.kv_overrides.back().key[0] == 0 && "KV overrides not terminated with empty key");
        mparams.kv_overrides = params.kv_overrides.data();
    }

    if (params.tensor_buft_overrides.empty()) {
        mparams.tensor_buft_overrides = NULL;
    } else {
        GGML_ASSERT(params.tensor_buft_overrides.back().pattern == nullptr && "Tensor buffer overrides not terminated with empty pattern");
        mparams.tensor_buft_overrides = params.tensor_buft_overrides.data();
    }

    return mparams;
}